

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::microfacet::eval(microfacet *this,vec3 *wi,vec3 *wo,void *user_args)

{
  impl *piVar1;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar2;
  undefined8 in_R8;
  float b;
  float_t fVar3;
  float_t fVar4;
  value_type vVar5;
  vec3 vVar6;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Constant,_float,_float>,_float>
  _Var7;
  float local_f4;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Constant,_float,_float>,_float>
  local_f0;
  undefined1 local_e0 [8];
  value_type F;
  float_t zd;
  float_t Gcd;
  float_t Dvis;
  float_t local_b8;
  undefined1 local_ac [8];
  vec3 wh;
  args args;
  float_t nrm;
  float_t local_48;
  undefined1 local_3c [8];
  vec3 tmp;
  void *user_args_local;
  vec3 *wo_local;
  vec3 *wi_local;
  microfacet *this_local;
  
  tmp._4_8_ = in_R8;
  vVar6 = djb::operator+(wo,(vec3 *)user_args);
  stack0xffffffffffffffb0 = vVar6._0_8_;
  local_3c._0_4_ = args.detm;
  local_3c._4_4_ = nrm;
  local_48 = vVar6.z;
  tmp.x = local_48;
  unique0x1000025b = vVar6;
  args.minv.r[2].z = dot((vec3 *)local_3c,(vec3 *)local_3c);
  if (args.minv.r[2].z <= 0.0) {
    (**(code **)(*(long *)wi + 0x10))(this);
    pfVar2 = extraout_RDX_00;
  }
  else {
    if (tmp._4_8_ == 0) {
      microfacet::args::standard();
    }
    else {
      memcpy(&wh.y,(void *)tmp._4_8_,0x4c);
    }
    b = inversesqrt<float>(&args.minv.r[2].z);
    vVar6 = djb::operator*((vec3 *)local_3c,b);
    _Gcd = vVar6._0_8_;
    local_ac._0_4_ = Gcd;
    local_ac._4_4_ = Dvis;
    local_b8 = vVar6.z;
    wh.x = local_b8;
    fVar3 = vndf((microfacet *)wi,(vec3 *)local_ac,wo,(args *)&wh.y);
    fVar4 = gcd((microfacet *)wi,(vec3 *)local_ac,wo,(vec3 *)user_args,(args *)&wh.y);
    F._M_data._0_4_ = dot((vec3 *)local_ac,wo);
    F._M_data._4_4_ = sat<float>((float *)&F._M_data);
    piVar1 = fresnel::ptr::operator->((ptr *)&wi->z);
    (*piVar1->_vptr_impl[4])((ulong)(uint)F._M_data._4_4_,local_e0);
    if (fVar4 <= 0.0) {
      (**(code **)(*(long *)wi + 0x10))(this);
    }
    else {
      local_f4 = (fVar3 * fVar4) / (F._M_data._4_4_ * 4.0);
      _Var7 = std::operator*((valarray<float> *)local_e0,&local_f4);
      local_f0._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr1 =
           _Var7._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr1;
      local_f0._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr2 =
           _Var7._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr2;
      std::valarray<float>::
      valarray<std::__detail::_BinClos<std::__multiplies,std::_ValArray,std::_Constant,float,float>>
                ((valarray<float> *)this,&local_f0);
    }
    std::valarray<float>::~valarray((valarray<float> *)local_e0);
    pfVar2 = extraout_RDX;
  }
  vVar5._M_data = pfVar2;
  vVar5._M_size = (size_t)this;
  return vVar5;
}

Assistant:

brdf::value_type
microfacet::eval(const vec3 &wi, const vec3 &wo, const void *user_args) const
{
	vec3 tmp = wi + wo;
	float_t nrm = dot(tmp, tmp);

	if (nrm > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wh = tmp * inversesqrt(nrm);
		float_t Dvis = vndf(wh, wi, args);
		float_t Gcd = gcd(wh, wi, wo, args);
		float_t zd = sat(dot(wh, wi));
		brdf::value_type F = m_fresnel->eval(zd);

		return Gcd > 0 ? F * ((Dvis * Gcd) / (4 * zd)) : zero_value();
	}

	return zero_value();
}